

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

roaring_bitmap_t * roaring_bitmap_xor(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  uint8_t uVar1;
  roaring_array_t *prVar2;
  _Bool _Var3;
  container_t *pcVar4;
  uint16_t *puVar5;
  roaring_bitmap_t *prVar6;
  uint uVar7;
  uint end_index;
  uint uVar8;
  uint uVar9;
  byte bVar10;
  uint16_t key;
  uint uVar11;
  uint8_t type2;
  uint8_t type1;
  uint8_t result_type;
  uint8_t local_61;
  uint8_t local_60;
  uint8_t local_5f;
  ushort local_5e;
  uint local_5c;
  roaring_array_t *local_58;
  roaring_array_t *local_50;
  ulong local_48;
  ulong local_40;
  container_t *local_38;
  
  local_5f = '\0';
  uVar9 = (x1->high_low_container).size;
  local_48 = (ulong)uVar9;
  prVar6 = x2;
  if (uVar9 != 0) {
    uVar8 = (x2->high_low_container).size;
    prVar6 = x1;
    if (uVar8 != 0) {
      local_58 = &roaring_bitmap_create_with_capacity(uVar8 + uVar9)->high_low_container;
      uVar9 = 0;
      bVar10 = 0;
      if (((x1->high_low_container).flags & 1) != 0) {
        bVar10 = (x2->high_low_container).flags & 1;
      }
      local_58->flags = local_58->flags & 0xfe | bVar10;
      key = *(x1->high_low_container).keys;
      puVar5 = (x2->high_low_container).keys;
      uVar11 = 0;
      local_50 = &x2->high_low_container;
      local_40 = (ulong)uVar8;
LAB_00111f2a:
      do {
        local_5e = *puVar5;
        uVar8 = uVar11;
        local_5c = uVar9;
        while( true ) {
          prVar2 = local_50;
          uVar9 = local_5c;
          uVar11 = uVar8 + 1;
          if (key == local_5e) break;
          if (local_5e <= key) {
            local_61 = local_50->typecodes[local_5c & 0xffff];
            pcVar4 = get_copy_of_container
                               (local_50->containers[local_5c & 0xffff],&local_61,
                                (_Bool)(local_50->flags & 1));
            uVar1 = local_61;
            if ((prVar2->flags & 1) != 0) {
              local_38 = pcVar4;
              ra_set_container_at_index(local_50,uVar9,pcVar4,local_61);
              pcVar4 = local_38;
            }
            ra_append(local_58,local_5e,pcVar4,uVar1);
            uVar9 = uVar9 + 1;
            uVar7 = (uint)local_40;
            end_index = uVar7;
            if (uVar9 == uVar7) goto LAB_0011217a;
            puVar5 = (uint16_t *)((ulong)((uVar9 & 0xffff) * 2) + (long)local_50->keys);
            uVar11 = uVar8;
            goto LAB_00111f2a;
          }
          local_60 = (x1->high_low_container).typecodes[(ulong)uVar8 & 0xffff];
          pcVar4 = get_copy_of_container
                             ((x1->high_low_container).containers[(ulong)uVar8 & 0xffff],&local_60,
                              (_Bool)((x1->high_low_container).flags & 1));
          uVar1 = local_60;
          if (((x1->high_low_container).flags & 1) != 0) {
            ra_set_container_at_index(&x1->high_low_container,uVar8,pcVar4,local_60);
          }
          ra_append(local_58,key,pcVar4,uVar1);
          if ((uint)local_48 == uVar11) {
            end_index = (uint)local_40;
            uVar7 = local_5c;
            goto LAB_00112137;
          }
          key = (x1->high_low_container).keys[uVar11 & 0xffff];
          uVar8 = uVar11;
        }
        local_60 = (x1->high_low_container).typecodes[uVar8 & 0xffff];
        local_61 = local_50->typecodes[local_5c & 0xffff];
        pcVar4 = container_xor((x1->high_low_container).containers[uVar8 & 0xffff],local_60,
                               local_50->containers[local_5c & 0xffff],local_61,&local_5f);
        uVar1 = local_5f;
        _Var3 = container_nonzero_cardinality(pcVar4,local_5f);
        if (_Var3) {
          ra_append(local_58,key,pcVar4,uVar1);
        }
        else {
          container_free(pcVar4,uVar1);
        }
        end_index = (uint)local_40;
        uVar9 = local_5c + 1;
        uVar7 = uVar9;
        uVar8 = uVar11;
        if (((uint)local_48 == uVar11) || (uVar9 == end_index)) {
LAB_0011217a:
          if (uVar8 == (uint)local_48) {
LAB_00112137:
            bVar10 = local_50->flags;
            x1 = (roaring_bitmap_t *)local_50;
            uVar8 = uVar7;
          }
          else {
            if (uVar7 != end_index) {
              return (roaring_bitmap_t *)local_58;
            }
            bVar10 = (x1->high_low_container).flags;
            end_index = (uint)local_48;
          }
          prVar2 = local_58;
          ra_append_copy_range(local_58,&x1->high_low_container,uVar8,end_index,(_Bool)(bVar10 & 1))
          ;
          return (roaring_bitmap_t *)prVar2;
        }
        key = (x1->high_low_container).keys[uVar11 & 0xffff];
        puVar5 = (uint16_t *)((ulong)((uVar9 & 0xffff) * 2) + (long)local_50->keys);
      } while( true );
    }
  }
  prVar6 = roaring_bitmap_copy(prVar6);
  return prVar6;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_xor(const roaring_bitmap_t *x1,
                                     const roaring_bitmap_t *x2) {
    uint8_t result_type = 0;
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    if (0 == length1) {
        return roaring_bitmap_copy(x2);
    }
    if (0 == length2) {
        return roaring_bitmap_copy(x1);
    }
    roaring_bitmap_t *answer =
        roaring_bitmap_create_with_capacity(length1 + length2);
    roaring_bitmap_set_copy_on_write(answer, is_cow(x1) && is_cow(x2));
    int pos1 = 0, pos2 = 0;
    uint8_t type1, type2;
    uint16_t s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
    uint16_t s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
    while (true) {
        if (s1 == s2) {
            container_t *c1 = ra_get_container_at_index(
                                    &x1->high_low_container, pos1, &type1);
            container_t *c2 = ra_get_container_at_index(
                                    &x2->high_low_container, pos2, &type2);
            container_t *c = container_xor(c1, type1, c2, type2, &result_type);

            if (container_nonzero_cardinality(c, result_type)) {
                ra_append(&answer->high_low_container, s1, c, result_type);
            } else {
                container_free(c, result_type);
            }
            ++pos1;
            ++pos2;
            if (pos1 == length1) break;
            if (pos2 == length2) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);

        } else if (s1 < s2) {  // s1 < s2
            container_t *c1 = ra_get_container_at_index(
                                &x1->high_low_container, pos1, &type1);
            c1 = get_copy_of_container(c1, &type1, is_cow(x1));
            if (is_cow(x1)) {
                ra_set_container_at_index(&x1->high_low_container, pos1, c1,
                                          type1);
            }
            ra_append(&answer->high_low_container, s1, c1, type1);
            pos1++;
            if (pos1 == length1) break;
            s1 = ra_get_key_at_index(&x1->high_low_container, pos1);

        } else {  // s1 > s2
            container_t *c2 = ra_get_container_at_index(
                                &x2->high_low_container, pos2, &type2);
            c2 = get_copy_of_container(c2, &type2, is_cow(x2));
            if (is_cow(x2)) {
                ra_set_container_at_index(&x2->high_low_container, pos2, c2,
                                          type2);
            }
            ra_append(&answer->high_low_container, s2, c2, type2);
            pos2++;
            if (pos2 == length2) break;
            s2 = ra_get_key_at_index(&x2->high_low_container, pos2);
        }
    }
    if (pos1 == length1) {
        ra_append_copy_range(&answer->high_low_container,
                             &x2->high_low_container, pos2, length2,
                             is_cow(x2));
    } else if (pos2 == length2) {
        ra_append_copy_range(&answer->high_low_container,
                             &x1->high_low_container, pos1, length1,
                             is_cow(x1));
    }
    return answer;
}